

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::ExtendsClauseSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ExtendsClauseSyntax *this,size_t index)

{
  Info *pIVar1;
  __index_type _Var2;
  ArgumentListSyntax *pAVar3;
  
  if (index == 2) {
    pAVar3 = this->arguments;
  }
  else {
    if (index != 1) {
      if (index == 0) {
        pIVar1 = (this->keyword).info;
        *(undefined8 *)
         &(__return_storage_ptr__->
          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
             *(undefined8 *)&this->keyword;
        *(Info **)((long)&(__return_storage_ptr__->
                          super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
                          super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                          .
                          super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  + 8) = pIVar1;
      }
      else {
        parsing::Token::Token((Token *)__return_storage_ptr__);
      }
      _Var2 = '\0';
      goto LAB_002c49b3;
    }
    pAVar3 = (ArgumentListSyntax *)(this->baseName).ptr;
    if (pAVar3 == (ArgumentListSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<slang::syntax::NameSyntax *>::get() const [T = slang::syntax::NameSyntax *]"
                );
    }
  }
  *(ArgumentListSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pAVar3;
  _Var2 = '\x01';
LAB_002c49b3:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ExtendsClauseSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return keyword;
        case 1: return baseName.get();
        case 2: return arguments;
        default: return nullptr;
    }
}